

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_sbbb(uint8_t dst,uint8_t src2,uint8_t src3)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  target_long tVar4;
  target_long tVar5;
  uint8_t src1;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint8_t src3_local;
  uint8_t src2_local;
  uint8_t dst_local;
  
  bVar3 = dst + src2 + src3;
  if (src3 == '\0') {
    bVar2 = bVar3 < src2;
  }
  else {
    bVar2 = bVar3 <= src2;
  }
  bVar1 = "\x04"[dst];
  tVar4 = lshift((ulong)dst,0);
  tVar5 = lshift((long)(int)(uint)(byte)((bVar3 ^ src2) & (bVar3 ^ dst)),4);
  return (uint)(bVar2 | bVar1) | (byte)(dst ^ bVar3 ^ src2) & 0x10 | (uint)(dst == '\0') << 6 |
         (uint)tVar4 & 0x80 | (uint)tVar5 & 0x800;
}

Assistant:

static int glue(compute_all_sbb, SUFFIX)(DATA_TYPE dst, DATA_TYPE src2,
                                         DATA_TYPE src3)
{
    int cf, pf, af, zf, sf, of;
    DATA_TYPE src1 = dst + src2 + src3;

    cf = (src3 ? src1 <= src2 : src1 < src2);
    pf = parity_table[(uint8_t)dst];
    af = (dst ^ src1 ^ src2) & 0x10;
    zf = (dst == 0) << 6;
    sf = lshift(dst, 8 - DATA_BITS) & 0x80;
    of = lshift((src1 ^ src2) & (src1 ^ dst), 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}